

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

idx_t __thiscall
duckdb::ColumnReader::GetValidCount(ColumnReader *this,uint8_t *defines,idx_t count,idx_t offset)

{
  ulong uVar1;
  
  if (defines != (uint8_t *)0x0) {
    uVar1 = count + offset;
    count = 0;
    for (; offset < uVar1; offset = offset + 1) {
      count = count + (this->column_schema->max_define == (ulong)defines[offset]);
    }
  }
  return count;
}

Assistant:

idx_t GetValidCount(uint8_t *defines, idx_t count, idx_t offset = 0) const {
		if (!defines) {
			return count;
		}
		idx_t valid_count = 0;
		for (idx_t i = offset; i < offset + count; i++) {
			valid_count += defines[i] == MaxDefine();
		}
		return valid_count;
	}